

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O3

int __thiscall UnitTest::UnitTester::finalize(UnitTester *this)

{
  ostream *poVar1;
  
  this->m_finalized = true;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n Testing done. ",0x10)
  ;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->passedTests);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," tests passed. ",0xf);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->failedTests);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," tests failed.",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return this->failedTests;
}

Assistant:

int finalize() {
    m_finalized = true;
    std::cout << "\n Testing done. " << passedTests << " tests passed. "
              << failedTests << " tests failed." << std::endl;
    return failedTests;
  }